

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall
spirv_cross::ParsedIR::set_decoration_string
          (ParsedIR *this,ID id,Decoration decoration,string *argument)

{
  mapped_type *pmVar1;
  long lStack_30;
  ID id_local;
  
  id_local = id;
  pmVar1 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->meta,&id_local);
  Bitset::set(&(pmVar1->decoration).decoration_flags,decoration);
  if (decoration == DecorationHlslSemanticGOOGLE) {
    lStack_30 = 0x40;
  }
  else {
    if (decoration != DecorationUserTypeGOOGLE) {
      return;
    }
    lStack_30 = 0x60;
  }
  ::std::__cxx11::string::_M_assign
            ((string *)((long)&(pmVar1->decoration).alias._M_dataplus._M_p + lStack_30));
  return;
}

Assistant:

void ParsedIR::set_decoration_string(ID id, Decoration decoration, const string &argument)
{
	auto &dec = meta[id].decoration;
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic = argument;
		break;

	case DecorationUserTypeGOOGLE:
		dec.user_type = argument;
		break;

	default:
		break;
	}
}